

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O0

void If_CutPropagateRequired(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut,float ObjRequired)

{
  int iVar1;
  float (*pafVar2) [33];
  If_Obj_t *pIVar3;
  bool bVar4;
  float local_98;
  float local_90;
  int local_8c;
  int local_88;
  float local_80;
  float local_78;
  float local_74;
  int Delay_2;
  int Delay_1;
  int Delay;
  char *pPerm;
  char Perm [15];
  int Pin2PinDelay;
  int i;
  float Required;
  float *pLutDelays;
  If_Obj_t *pLeaf;
  float ObjRequired_local;
  If_Cut_t *pCut_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  if (p->pPars->fLiftLeaves != 0) {
    __assert_fail("!p->pPars->fLiftLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                  ,0xba,"void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)");
  }
  if ((*(uint *)&pCut->field_0x1c >> 0xf & 1) == 0) {
    if (p->pPars->pLutLib == (If_LibLut_t *)0x0) {
      if ((*(uint *)&pCut->field_0x1c >> 0xd & 1) == 0) {
        Perm[0xb] = '\0';
        Perm[0xc] = '\0';
        Perm[0xd] = '\0';
        Perm[0xe] = '\0';
        while( true ) {
          bVar4 = false;
          if ((int)Perm._11_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            pLutDelays = (float *)If_ManObj(p,(int)(&pCut[1].Area)[(int)Perm._11_4_]);
            bVar4 = (If_Obj_t *)pLutDelays != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          if (ObjRequired - 1.0 <= pLutDelays[0xd]) {
            local_98 = ObjRequired - 1.0;
          }
          else {
            local_98 = pLutDelays[0xd];
          }
          pLutDelays[0xd] = local_98;
          Perm._11_4_ = Perm._11_4_ + 1;
        }
      }
      else {
        _Delay_1 = (char *)((long)&pPerm + 5);
        if (p->pPars->fDelayOpt == 0) {
          if (p->pPars->fDelayOptLut == 0) {
            if (p->pPars->fDsdBalance == 0) {
              _Delay_1 = If_CutPerm(pCut);
            }
            else {
              iVar1 = If_CutDsdBalancePinDelays(p,pCut,_Delay_1);
              if (iVar1 != (int)pCut->Delay) {
                __assert_fail("Delay == (int)pCut->Delay",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                              ,0xe8,
                              "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                             );
              }
            }
          }
          else {
            iVar1 = If_CutLutBalancePinDelays(p,pCut,_Delay_1);
            if (iVar1 != (int)pCut->Delay) {
              __assert_fail("Delay == (int)pCut->Delay",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                            ,0xe3,
                            "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                           );
            }
          }
        }
        else {
          iVar1 = If_CutSopBalancePinDelays(p,pCut,_Delay_1);
          if (iVar1 != (int)pCut->Delay) {
            __assert_fail("Delay == (int)pCut->Delay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                          ,0xde,
                          "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)")
            ;
          }
        }
        Perm[0xb] = '\0';
        Perm[0xc] = '\0';
        Perm[0xd] = '\0';
        Perm[0xe] = '\0';
        while( true ) {
          bVar4 = false;
          if ((int)Perm._11_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            pLutDelays = (float *)If_ManObj(p,(int)(&pCut[1].Area)[(int)Perm._11_4_]);
            bVar4 = (If_Obj_t *)pLutDelays != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          if (_Delay_1 == (char *)0x0) {
            local_8c = 1;
          }
          else {
            if (_Delay_1[(int)Perm._11_4_] == 'x') {
              local_88 = -0x78;
            }
            else {
              local_88 = (int)_Delay_1[(int)Perm._11_4_];
            }
            local_8c = local_88;
          }
          Perm._7_4_ = local_8c;
          local_90 = ObjRequired - (float)local_8c;
          if (pLutDelays[0xd] < local_90) {
            local_90 = pLutDelays[0xd];
          }
          pLutDelays[0xd] = local_90;
          Perm._11_4_ = Perm._11_4_ + 1;
        }
      }
    }
    else {
      pafVar2 = p->pPars->pLutLib->pLutDelays + (*(uint *)&pCut->field_0x1c >> 0x18);
      if (p->pPars->pLutLib->fVarPinDelays == 0) {
        Perm[0xb] = '\0';
        Perm[0xc] = '\0';
        Perm[0xd] = '\0';
        Perm[0xe] = '\0';
        while( true ) {
          bVar4 = false;
          if ((int)Perm._11_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            pLutDelays = (float *)If_ManObj(p,(int)(&pCut[1].Area)[(int)Perm._11_4_]);
            bVar4 = (If_Obj_t *)pLutDelays != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          if (ObjRequired - (*pafVar2)[0] <= pLutDelays[0xd]) {
            local_80 = ObjRequired - (*pafVar2)[0];
          }
          else {
            local_80 = pLutDelays[0xd];
          }
          pLutDelays[0xd] = local_80;
          Perm._11_4_ = Perm._11_4_ + 1;
        }
      }
      else {
        If_CutSortInputPins(p,pCut,If_CutPropagateRequired::pPinPerm,
                            If_CutPropagateRequired::pPinDelays);
        Perm[0xb] = '\0';
        Perm[0xc] = '\0';
        Perm[0xd] = '\0';
        Perm[0xe] = '\0';
        for (; (int)Perm._11_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18);
            Perm._11_4_ = Perm._11_4_ + 1) {
          local_78 = ObjRequired - (*pafVar2)[(int)Perm._11_4_];
          pIVar3 = If_ManObj(p,(int)(&pCut[1].Area)
                                    [If_CutPropagateRequired::pPinPerm[(int)Perm._11_4_]]);
          if (pIVar3->Required < local_78) {
            local_78 = pIVar3->Required;
          }
          pIVar3->Required = local_78;
        }
      }
    }
  }
  else {
    Perm[0xb] = '\0';
    Perm[0xc] = '\0';
    Perm[0xd] = '\0';
    Perm[0xe] = '\0';
    while( true ) {
      bVar4 = false;
      if ((int)Perm._11_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
        pLutDelays = (float *)If_ManObj(p,(int)(&pCut[1].Area)[(int)Perm._11_4_]);
        bVar4 = (If_Obj_t *)pLutDelays != (If_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if (ObjRequired - (float)p->pPars->nAndDelay <= pLutDelays[0xd]) {
        local_74 = ObjRequired - (float)p->pPars->nAndDelay;
      }
      else {
        local_74 = pLutDelays[0xd];
      }
      pLutDelays[0xd] = local_74;
      Perm._11_4_ = Perm._11_4_ + 1;
    }
  }
  return;
}

Assistant:

void If_CutPropagateRequired( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut, float ObjRequired )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    If_Obj_t * pLeaf;
    float * pLutDelays;
    float Required;
    int i, Pin2PinDelay;//, iLeaf;
    assert( !p->pPars->fLiftLeaves );
    // compute the pins
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            pLeaf->Required = IF_MIN( pLeaf->Required, ObjRequired - p->pPars->nAndDelay );
    }
    else if ( p->pPars->pLutLib )
    {
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                Required = ObjRequired - pLutDelays[i];
                pLeaf = If_ManObj( p, pCut->pLeaves[pPinPerm[i]] );
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - pLutDelays[0] );
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            char Perm[IF_MAX_FUNC_LUTSIZE], * pPerm = Perm;
            if ( p->pPars->fDelayOpt )
            {
                int Delay = If_CutSopBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDelayOptLut )
            {
                int Delay = If_CutLutBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDsdBalance )
            {
                int Delay = If_CutDsdBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else
                pPerm = If_CutPerm(pCut);
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                Required = ObjRequired - (float)Pin2PinDelay;
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - (float)1.0 );
        }
    }
}